

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCount.cpp
# Opt level: O0

int countChildElements(DOMNode *n,bool printOutEncounteredEles)

{
  int iVar1;
  wchar16 *pwVar2;
  ostream *poVar3;
  ulong uVar4;
  char *local_58;
  char *name_1;
  DOMAttr *pAttributeNode;
  XMLSize_t i;
  XMLSize_t nSize;
  DOMNamedNodeMap *pAttributes;
  char *name;
  DOMNode *pDStack_20;
  int count;
  DOMNode *child;
  DOMNode *pDStack_10;
  bool printOutEncounteredEles_local;
  DOMNode *n_local;
  
  name._4_4_ = 0;
  if (n != (DOMNode *)0x0) {
    child._7_1_ = printOutEncounteredEles;
    pDStack_10 = n;
    iVar1 = (**(code **)(*(long *)n + 0x20))();
    if (iVar1 == 1) {
      if ((child._7_1_ & 1) != 0) {
        pwVar2 = (wchar16 *)(**(code **)(*(long *)pDStack_10 + 0x10))();
        pAttributes = (DOMNamedNodeMap *)
                      xercesc_4_0::XMLString::transcode
                                (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"Encountered Element : ");
        poVar3 = std::operator<<(poVar3,(char *)pAttributes);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        xercesc_4_0::XMLString::release
                  ((char **)&pAttributes,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        uVar4 = (**(code **)(*(long *)pDStack_10 + 0xd0))();
        if ((uVar4 & 1) != 0) {
          nSize = (**(code **)(*(long *)pDStack_10 + 0x58))();
          i = (**(code **)(*(long *)nSize + 0x28))();
          poVar3 = std::operator<<((ostream *)&std::cout,"\tAttributes");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<((ostream *)&std::cout,"\t----------");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          for (pAttributeNode = (DOMAttr *)0x0; pAttributeNode < i;
              pAttributeNode = pAttributeNode + 1) {
            name_1 = (char *)(**(code **)(*(long *)nSize + 0x18))(nSize,pAttributeNode);
            pwVar2 = (wchar16 *)(**(code **)(*(long *)name_1 + 0x140))();
            local_58 = (char *)xercesc_4_0::XMLString::transcode
                                         (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            poVar3 = std::operator<<((ostream *)&std::cout,"\t");
            poVar3 = std::operator<<(poVar3,local_58);
            std::operator<<(poVar3,"=");
            xercesc_4_0::XMLString::release
                      (&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            pwVar2 = (wchar16 *)(**(code **)(*(long *)name_1 + 0x150))();
            local_58 = (char *)xercesc_4_0::XMLString::transcode
                                         (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            poVar3 = std::operator<<((ostream *)&std::cout,local_58);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            xercesc_4_0::XMLString::release
                      (&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          }
        }
      }
      name._4_4_ = name._4_4_ + 1;
    }
    for (pDStack_20 = (DOMNode *)(**(code **)(*(long *)pDStack_10 + 0x38))();
        pDStack_20 != (DOMNode *)0x0;
        pDStack_20 = (DOMNode *)(**(code **)(*(long *)pDStack_20 + 0x50))()) {
      iVar1 = countChildElements(pDStack_20,(bool)(child._7_1_ & 1));
      name._4_4_ = iVar1 + name._4_4_;
    }
  }
  return name._4_4_;
}

Assistant:

static int countChildElements(DOMNode *n, bool printOutEncounteredEles)
{
    DOMNode *child;
    int count = 0;
    if (n) {
        if (n->getNodeType() == DOMNode::ELEMENT_NODE)
		{
            if(printOutEncounteredEles) {
                char *name = XMLString::transcode(n->getNodeName());
                std::cout <<"----------------------------------------------------------"<<std::endl;
                std::cout <<"Encountered Element : "<< name << std::endl;

                XMLString::release(&name);

                if(n->hasAttributes()) {
                    // get all the attributes of the node
                    DOMNamedNodeMap *pAttributes = n->getAttributes();
                    const XMLSize_t nSize = pAttributes->getLength();
                    std::cout <<"\tAttributes" << std::endl;
                    std::cout <<"\t----------" << std::endl;
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        // get attribute name
                        char *name = XMLString::transcode(pAttributeNode->getName());

                        std::cout << "\t" << name << "=";
                        XMLString::release(&name);

                        // get attribute type
                        name = XMLString::transcode(pAttributeNode->getValue());
                        std::cout << name << std::endl;
                        XMLString::release(&name);
                    }
                }
            }
			++count;
		}
        for (child = n->getFirstChild(); child != 0; child=child->getNextSibling())
            count += countChildElements(child, printOutEncounteredEles);
    }
    return count;
}